

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O1

size_t pstore::utf::length<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        last)

{
  size_t sVar1;
  
  sVar1 = 0;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    sVar1 = sVar1 + 1;
  }
  if (-1 < (long)sVar1) {
    return sVar1;
  }
  assert_failed("result >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/utf.hpp"
                ,0x144);
}

Assistant:

auto length (Iterator first, Iterator last) -> std::size_t {
            auto const result =
                std::count_if (first, last, [] (char const c) { return is_utf_char_start (c); });
            PSTORE_ASSERT (result >= 0);
            using utype = typename std::make_unsigned<decltype (result)>::type;
            static_assert (std::numeric_limits<utype>::max () <=
                               std::numeric_limits<std::size_t>::max (),
                           "std::size_t cannot hold result of count_if");
            return static_cast<std::size_t> (result);
        }